

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::BufferComputeInstance::writeDescriptorSetWithTemplate
          (BufferComputeInstance *this,VkDescriptorSet descriptorSet,VkDescriptorSetLayout layout,
          VkBuffer viewA,deUint32 offsetA,VkBuffer viewB,deUint32 offsetB,VkBuffer resBuf,
          bool withPush,VkPipelineLayout pipelineLayout)

{
  ShaderInputInterface SVar1;
  VkDescriptorType VVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  deUint64 dVar5;
  RefData<vk::Handle<(vk::HandleType)32>_> data;
  size_t sVar6;
  size_type sVar7;
  Handle<(vk::HandleType)32> *pHVar8;
  deUint8 *pdVar9;
  Move<vk::Handle<(vk::HandleType)32>_> local_208;
  RefData<vk::Handle<(vk::HandleType)32>_> local_1e8;
  VkDescriptorUpdateTemplateEntryKHR local_1c8;
  VkDescriptorUpdateTemplateEntryKHR local_1a8;
  VkDescriptorUpdateTemplateEntryKHR local_188;
  VkDescriptorUpdateTemplateEntryKHR local_168;
  VkDescriptorUpdateTemplateEntryKHR local_148;
  undefined1 local_118 [8];
  VkDescriptorUpdateTemplateCreateInfoKHR templateCreateInfo;
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  updateEntries;
  undefined1 local_a8 [8];
  VkDescriptorBufferInfo bufferInfos [2];
  undefined1 local_68 [8];
  VkDescriptorBufferInfo resultInfo;
  bool withPush_local;
  deUint32 offsetA_local;
  BufferComputeInstance *this_local;
  VkPipelineLayout pipelineLayout_local;
  VkBuffer resBuf_local;
  VkBuffer viewB_local;
  VkBuffer viewA_local;
  VkDescriptorSetLayout layout_local;
  VkDescriptorSet descriptorSet_local;
  
  resultInfo.range._3_1_ = withPush;
  resultInfo.range._4_4_ = offsetA;
  ::vk::makeDescriptorBufferInfo((VkDescriptorBufferInfo *)local_68,resBuf,0,0x40);
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_a8,viewA,(ulong)resultInfo.range._4_4_,0x20);
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)&bufferInfos[0].range,viewB,(ulong)offsetB,0x20);
  std::
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::vector((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
            *)&templateCreateInfo.set);
  local_118._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR;
  templateCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  templateCreateInfo._4_4_ = 0;
  templateCreateInfo.pNext._0_4_ = 0;
  templateCreateInfo.pNext._4_4_ = 0;
  templateCreateInfo.flags = 0;
  templateCreateInfo.descriptorUpdateEntryCount = 0;
  templateCreateInfo.pDescriptorUpdateEntries._0_4_ = resultInfo.range._3_1_ & 1;
  templateCreateInfo.descriptorSetLayout.m_internal._0_4_ = 1;
  templateCreateInfo._48_8_ = pipelineLayout.m_internal;
  templateCreateInfo.pipelineLayout.m_internal._0_4_ = 0;
  templateCreateInfo._32_8_ = layout.m_internal;
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorBufferInfo>
            (&this->m_updateRegistry,(VkDescriptorBufferInfo *)local_68);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorBufferInfo>
            (&this->m_updateRegistry,(VkDescriptorBufferInfo *)local_a8);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorBufferInfo>
            (&this->m_updateRegistry,(VkDescriptorBufferInfo *)&bufferInfos[0].range);
  sVar6 = RawUpdateRegistry::getWriteObjectOffset(&this->m_updateRegistry,0);
  createTemplateBinding(&local_148,0,0,1,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,sVar6,0);
  std::
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
               *)&templateCreateInfo.set,&local_148);
  SVar1 = this->m_shaderInterface;
  if (SVar1 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    VVar2 = this->m_descriptorType;
    sVar6 = RawUpdateRegistry::getWriteObjectOffset(&this->m_updateRegistry,1);
    createTemplateBinding(&local_168,1,0,1,VVar2,sVar6,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_168);
  }
  else if (SVar1 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    VVar2 = this->m_descriptorType;
    sVar6 = RawUpdateRegistry::getWriteObjectOffset(&this->m_updateRegistry,1);
    createTemplateBinding(&local_188,1,0,1,VVar2,sVar6,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_188);
    VVar2 = this->m_descriptorType;
    sVar6 = RawUpdateRegistry::getWriteObjectOffset(&this->m_updateRegistry,2);
    createTemplateBinding(&local_1a8,2,0,1,VVar2,sVar6,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_1a8);
  }
  else if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    VVar2 = this->m_descriptorType;
    sVar6 = RawUpdateRegistry::getWriteObjectOffset(&this->m_updateRegistry,1);
    createTemplateBinding(&local_1c8,1,0,2,VVar2,sVar6,0x18);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_1c8);
  }
  templateCreateInfo._16_8_ =
       std::
       vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
       ::operator[]((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                     *)&templateCreateInfo.set,0);
  sVar7 = std::
          vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
          ::size((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                  *)&templateCreateInfo.set);
  templateCreateInfo.pNext._4_4_ = (undefined4)sVar7;
  ::vk::createDescriptorUpdateTemplateKHR
            (&local_208,this->m_vki,this->m_device,
             (VkDescriptorUpdateTemplateCreateInfoKHR *)local_118,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1e8,(Move *)&local_208);
  data.deleter.m_deviceIface = local_1e8.deleter.m_deviceIface;
  data.object.m_internal = local_1e8.object.m_internal;
  data.deleter.m_device = local_1e8.deleter.m_device;
  data.deleter.m_allocator = local_1e8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)32>_>::operator=(&this->m_updateTemplate,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)32>_>::~Move(&local_208);
  if ((resultInfo.range._3_1_ & 1) == 0) {
    pDVar3 = this->m_vki;
    pVVar4 = this->m_device;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)32>_>::operator*
                       (&(this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>);
    dVar5 = pHVar8->m_internal;
    pdVar9 = RawUpdateRegistry::getRawPointer(&this->m_updateRegistry);
    (*pDVar3->_vptr_DeviceInterface[0x92])(pDVar3,pVVar4,descriptorSet.m_internal,dVar5,pdVar9);
  }
  std::
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::~vector((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
             *)&templateCreateInfo.set);
  return;
}

Assistant:

void BufferComputeInstance::writeDescriptorSetWithTemplate (vk::VkDescriptorSet descriptorSet, vk::VkDescriptorSetLayout layout, vk::VkBuffer viewA, deUint32 offsetA, vk::VkBuffer viewB, deUint32 offsetB, vk::VkBuffer resBuf, bool withPush, vk::VkPipelineLayout pipelineLayout)
{
	const vk::VkDescriptorBufferInfo						resultInfo			= vk::makeDescriptorBufferInfo(resBuf, 0u, (vk::VkDeviceSize)ComputeInstanceResultBuffer::DATA_SIZE);
	const vk::VkDescriptorBufferInfo						bufferInfos[2]		=
	{
		vk::makeDescriptorBufferInfo(viewA, (vk::VkDeviceSize)offsetA, (vk::VkDeviceSize)sizeof(tcu::Vec4[2])),
		vk::makeDescriptorBufferInfo(viewB, (vk::VkDeviceSize)offsetB, (vk::VkDeviceSize)sizeof(tcu::Vec4[2])),
	};
	std::vector<vk::VkDescriptorUpdateTemplateEntryKHR>		updateEntries;
	vk::VkDescriptorUpdateTemplateCreateInfoKHR				templateCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR,
		DE_NULL,
		0,
		0,			// descriptorUpdateEntryCount
		DE_NULL,	// pDescriptorUpdateEntries
		withPush ? vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_PUSH_DESCRIPTORS_KHR : vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_DESCRIPTOR_SET_KHR,
		layout,
		vk::VK_PIPELINE_BIND_POINT_COMPUTE,
		pipelineLayout,
		0
	};
	m_updateRegistry.addWriteObject(resultInfo);
	m_updateRegistry.addWriteObject(bufferInfos[0]);
	m_updateRegistry.addWriteObject(bufferInfos[1]);

	// result
	updateEntries.push_back(createTemplateBinding(0, 0, 1, vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, m_updateRegistry.getWriteObjectOffset(0), 0));

	// buffers
	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			updateEntries.push_back(createTemplateBinding(1, 0, 1, m_descriptorType, m_updateRegistry.getWriteObjectOffset(1), 0));
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			updateEntries.push_back(createTemplateBinding(1, 0, 1, m_descriptorType, m_updateRegistry.getWriteObjectOffset(1), 0));
			updateEntries.push_back(createTemplateBinding(2, 0, 1, m_descriptorType, m_updateRegistry.getWriteObjectOffset(2), 0));
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			updateEntries.push_back(createTemplateBinding(1, 0, 2, m_descriptorType, m_updateRegistry.getWriteObjectOffset(1), sizeof(bufferInfos[0])));
			break;

		default:
			DE_FATAL("Impossible");
	}

	templateCreateInfo.pDescriptorUpdateEntries			= &updateEntries[0];
	templateCreateInfo.descriptorUpdateEntryCount		= (deUint32)updateEntries.size();

	m_updateTemplate									= vk::createDescriptorUpdateTemplateKHR(m_vki, m_device, &templateCreateInfo);

	if (!withPush)
	{
		m_vki.updateDescriptorSetWithTemplateKHR(m_device, descriptorSet, *m_updateTemplate, m_updateRegistry.getRawPointer());
	}
}